

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O3

int32_t __thiscall llama_kv_cache_unified::get_n_tokens(llama_kv_cache_unified *this)

{
  int iVar1;
  long lVar2;
  
  if ((ulong)this->size != 0) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + *(int *)((long)&(((this->cells).
                                        super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->seq_id)._M_t.
                                      _M_impl + lVar2 + 0x28);
      lVar2 = lVar2 + 0x40;
    } while ((ulong)this->size << 6 != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int32_t llama_kv_cache_unified::get_n_tokens() const {
    int32_t result = 0;

    for (uint32_t i = 0; i < size; i++) {
        result += cells[i].seq_id.size();
    }

    return result;
}